

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

DefinitionSymbol * __thiscall
slang::ast::Compilation::getDefinition
          (Compilation *this,Scope *scope,ModuleDeclarationSyntax *syntax)

{
  group_type_pointer pgVar1;
  char *pcVar2;
  undefined4 uVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  RootSymbol *pRVar6;
  DefinitionSymbol *pDVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  value_type *elements_2;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*> *ppVar19;
  long *plVar20;
  uchar uVar21;
  char cVar22;
  uchar uVar23;
  char cVar24;
  uchar uVar25;
  char cVar26;
  uchar uVar27;
  char cVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  try_emplace_args_t local_f9;
  Scope *insertScope;
  Compilation *local_f0;
  undefined8 local_e8;
  long *local_e0;
  ulong local_d8;
  DefinitionSymbol *local_d0;
  SmallMap<const_slang::ast::Scope_*,_const_slang::ast::DefinitionSymbol_*,_4UL,_std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
  scopeMap;
  locator res;
  
  auVar9._8_8_ = 0;
  auVar9._0_8_ = syntax;
  uVar13 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar16 = uVar13 >> ((byte)(this->definitionFromSyntax).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar4 = (this->definitionFromSyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
           .arrays.groups_;
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar13 & 0xff];
  ppVar5 = (this->definitionFromSyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
           .arrays.elements_;
  uVar15 = (this->definitionFromSyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
           .arrays.groups_size_mask;
  uVar18 = 0;
  do {
    pgVar1 = pgVar4 + uVar16;
    uVar21 = (uchar)uVar3;
    auVar29[0] = -(pgVar1->m[0].n == uVar21);
    uVar23 = (uchar)((uint)uVar3 >> 8);
    auVar29[1] = -(pgVar1->m[1].n == uVar23);
    uVar25 = (uchar)((uint)uVar3 >> 0x10);
    auVar29[2] = -(pgVar1->m[2].n == uVar25);
    uVar27 = (uchar)((uint)uVar3 >> 0x18);
    auVar29[3] = -(pgVar1->m[3].n == uVar27);
    auVar29[4] = -(pgVar1->m[4].n == uVar21);
    auVar29[5] = -(pgVar1->m[5].n == uVar23);
    auVar29[6] = -(pgVar1->m[6].n == uVar25);
    auVar29[7] = -(pgVar1->m[7].n == uVar27);
    auVar29[8] = -(pgVar1->m[8].n == uVar21);
    auVar29[9] = -(pgVar1->m[9].n == uVar23);
    auVar29[10] = -(pgVar1->m[10].n == uVar25);
    auVar29[0xb] = -(pgVar1->m[0xb].n == uVar27);
    auVar29[0xc] = -(pgVar1->m[0xc].n == uVar21);
    auVar29[0xd] = -(pgVar1->m[0xd].n == uVar23);
    auVar29[0xe] = -(pgVar1->m[0xe].n == uVar25);
    auVar29[0xf] = -(pgVar1->m[0xf].n == uVar27);
    for (uVar14 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe); uVar14 != 0;
        uVar14 = uVar14 - 1 & uVar14) {
      iVar8 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
        }
      }
      if (*(ModuleDeclarationSyntax **)
           ((long)&ppVar5[uVar16 * 0xf].first + (ulong)(uint)(iVar8 << 5)) == syntax) {
        lVar17 = (long)&ppVar5[uVar16 * 0xf].first + (ulong)(uint)(iVar8 << 5);
        goto LAB_0014e0b9;
      }
    }
    if ((pgVar4[uVar16].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7]) == 0) break;
    lVar17 = uVar16 + uVar18;
    uVar18 = uVar18 + 1;
    uVar16 = lVar17 + 1U & uVar15;
  } while (uVar18 <= uVar15);
  lVar17 = 0;
LAB_0014e0b9:
  if (lVar17 != 0) {
    scopeMap.super_Storage.ptr = (char *)&scopeMap;
    scopeMap._80_8_ = 0x3f;
    scopeMap._88_8_ = 1;
    scopeMap._104_8_ = 0;
    uVar12 = scopeMap._104_8_;
    scopeMap._96_8_ =
         boost::unordered::detail::foa::
         dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
         ::storage;
    scopeMap._104_8_ = 0;
    scopeMap._112_8_ = 0;
    scopeMap._120_8_ = 0;
    plVar20 = *(long **)(lVar17 + 8);
    local_e0 = *(long **)(lVar17 + 0x10);
    local_f0 = this;
    scopeMap.super_Storage._72_8_ = scopeMap.super_Storage.ptr;
    if (plVar20 != local_e0) {
      do {
        local_d0 = (DefinitionSymbol *)*plVar20;
        insertScope = (local_d0->super_Symbol).parentScope;
        if (((insertScope != (Scope *)0x0) && (insertScope->thisSym->kind == CompilationUnit)) &&
           (pRVar6 = (local_f0->root)._M_t.
                     super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                     .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl,
           insertScope = &pRVar6->super_Scope, pRVar6 == (RootSymbol *)0x0)) {
          insertScope = (Scope *)0x0;
        }
        auVar10._8_8_ = 0;
        auVar10._0_8_ = insertScope;
        uVar18 = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar16 = uVar18 >> (scopeMap._80_1_ & 0x3f);
        uVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar18 & 0xff];
        local_e8 = scopeMap._88_8_;
        uVar15 = uVar16;
        uVar13 = 0;
        do {
          local_d8 = uVar13;
          pcVar2 = (char *)(scopeMap._96_8_ + uVar15 * 0x10);
          cVar22 = (char)uVar3;
          auVar30[0] = -(*pcVar2 == cVar22);
          cVar24 = (char)((uint)uVar3 >> 8);
          auVar30[1] = -(pcVar2[1] == cVar24);
          cVar26 = (char)((uint)uVar3 >> 0x10);
          auVar30[2] = -(pcVar2[2] == cVar26);
          cVar28 = (char)((uint)uVar3 >> 0x18);
          auVar30[3] = -(pcVar2[3] == cVar28);
          auVar30[4] = -(pcVar2[4] == cVar22);
          auVar30[5] = -(pcVar2[5] == cVar24);
          auVar30[6] = -(pcVar2[6] == cVar26);
          auVar30[7] = -(pcVar2[7] == cVar28);
          auVar30[8] = -(pcVar2[8] == cVar22);
          auVar30[9] = -(pcVar2[9] == cVar24);
          auVar30[10] = -(pcVar2[10] == cVar26);
          auVar30[0xb] = -(pcVar2[0xb] == cVar28);
          auVar30[0xc] = -(pcVar2[0xc] == cVar22);
          auVar30[0xd] = -(pcVar2[0xd] == cVar24);
          auVar30[0xe] = -(pcVar2[0xe] == cVar26);
          auVar30[0xf] = -(pcVar2[0xf] == cVar28);
          uVar14 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe);
          if (uVar14 != 0) {
            lVar17 = scopeMap._104_8_ + uVar15 * 0xf0;
            do {
              iVar8 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
                }
              }
              if (insertScope == *(Scope **)(lVar17 + (ulong)(uint)(iVar8 << 4))) {
                ppVar19 = (pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>
                           *)((ulong)(uint)(iVar8 << 4) + lVar17);
                goto LAB_0014e265;
              }
              uVar14 = uVar14 - 1 & uVar14;
            } while (uVar14 != 0);
          }
          if ((*(byte *)(uVar15 * 0x10 + scopeMap._96_8_ + 0xf) &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7]) == 0) break;
          uVar15 = uVar15 + local_d8 + 1 & scopeMap._88_8_;
          uVar13 = local_d8 + 1;
        } while (local_d8 + 1 <= (ulong)scopeMap._88_8_);
        ppVar19 = (pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*> *)0x0;
LAB_0014e265:
        if (ppVar19 ==
            (pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*> *)0x0) {
          if ((ulong)scopeMap._120_8_ < (ulong)scopeMap._112_8_) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Scope_const*const,slang::ast::DefinitionSymbol_const*>,64ul,16ul>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Scope_const*const&>
                      (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Scope_const*const,slang::ast::DefinitionSymbol_const*>,64ul,16ul>>
                             *)&scopeMap.super_Storage.field_0x48,
                       (arrays_type *)&scopeMap.field_0x50,uVar16,uVar18,&local_f9,&insertScope);
            scopeMap._120_8_ = scopeMap._120_8_ + 1;
            ppVar19 = res.p;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Scope_const*const,slang::ast::DefinitionSymbol_const*>,64ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Scope_const*const&>
                      (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Scope_const*const,slang::ast::DefinitionSymbol_const*>,64ul,16ul>>
                             *)&scopeMap.super_Storage.field_0x48,uVar18,&local_f9,&insertScope);
            ppVar19 = res.p;
          }
        }
        ppVar19->second = local_d0;
        plVar20 = plVar20 + 1;
        uVar12 = scopeMap._104_8_;
      } while (plVar20 != local_e0);
    }
    do {
      scopeMap._104_8_ = uVar12;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = scope;
      uVar13 = SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar15 = uVar13 >> (scopeMap._80_1_ & 0x3f);
      uVar3 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar13 & 0xff];
      uVar16 = 0;
      do {
        pcVar2 = (char *)(scopeMap._96_8_ + uVar15 * 0x10);
        cVar22 = (char)uVar3;
        auVar31[0] = -(*pcVar2 == cVar22);
        cVar24 = (char)((uint)uVar3 >> 8);
        auVar31[1] = -(pcVar2[1] == cVar24);
        cVar26 = (char)((uint)uVar3 >> 0x10);
        auVar31[2] = -(pcVar2[2] == cVar26);
        cVar28 = (char)((uint)uVar3 >> 0x18);
        auVar31[3] = -(pcVar2[3] == cVar28);
        auVar31[4] = -(pcVar2[4] == cVar22);
        auVar31[5] = -(pcVar2[5] == cVar24);
        auVar31[6] = -(pcVar2[6] == cVar26);
        auVar31[7] = -(pcVar2[7] == cVar28);
        auVar31[8] = -(pcVar2[8] == cVar22);
        auVar31[9] = -(pcVar2[9] == cVar24);
        auVar31[10] = -(pcVar2[10] == cVar26);
        auVar31[0xb] = -(pcVar2[0xb] == cVar28);
        auVar31[0xc] = -(pcVar2[0xc] == cVar22);
        auVar31[0xd] = -(pcVar2[0xd] == cVar24);
        auVar31[0xe] = -(pcVar2[0xe] == cVar26);
        auVar31[0xf] = -(pcVar2[0xf] == cVar28);
        uVar14 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe);
        if (uVar14 != 0) {
          lVar17 = scopeMap._104_8_ + uVar15 * 0xf0;
          do {
            iVar8 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
              }
            }
            if (scope == *(Scope **)(lVar17 + (ulong)(uint)(iVar8 << 4))) {
              lVar17 = (ulong)(uint)(iVar8 << 4) + lVar17;
              goto LAB_0014e3dc;
            }
            uVar14 = uVar14 - 1 & uVar14;
          } while (uVar14 != 0);
        }
        if ((*(byte *)(uVar15 * 0x10 + scopeMap._96_8_ + 0xf) &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7]) == 0) break;
        lVar17 = uVar15 + uVar16;
        uVar16 = uVar16 + 1;
        uVar15 = lVar17 + 1U & scopeMap._88_8_;
      } while (uVar16 <= (ulong)scopeMap._88_8_);
      lVar17 = 0;
LAB_0014e3dc:
      if (lVar17 != 0) {
        pDVar7 = *(DefinitionSymbol **)(lVar17 + 8);
        boost::unordered::detail::foa::
        table_arrays<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
        ::delete_((allocator_type)scopeMap.super_Storage._72_8_,
                  (table_arrays<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
                   *)&scopeMap.field_0x50);
        return pDVar7;
      }
      scope = scope->thisSym->parentScope;
      uVar12 = scopeMap._104_8_;
    } while (scope != (Scope *)0x0);
    boost::unordered::detail::foa::
    table_arrays<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
    ::delete_((allocator_type)scopeMap.super_Storage._72_8_,
              (table_arrays<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
               *)&scopeMap.field_0x50);
  }
  return (DefinitionSymbol *)0x0;
}

Assistant:

const DefinitionSymbol* Compilation::getDefinition(const Scope& scope,
                                                   const ModuleDeclarationSyntax& syntax) const {
    if (auto it = definitionFromSyntax.find(&syntax); it != definitionFromSyntax.end()) {
        SmallMap<const Scope*, const DefinitionSymbol*, 4> scopeMap;
        for (auto def : it->second) {
            auto insertScope = def->getParentScope();
            if (insertScope && insertScope->asSymbol().kind == SymbolKind::CompilationUnit)
                insertScope = root.get();

            scopeMap[insertScope] = def;
        }

        auto lookupScope = &scope;
        do {
            if (auto scopeIt = scopeMap.find(lookupScope); scopeIt != scopeMap.end())
                return scopeIt->second;

            lookupScope = lookupScope->asSymbol().getParentScope();
        } while (lookupScope);
    }
    return nullptr;
}